

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_typical_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  size_type sVar1;
  reference pvVar2;
  long *in_RSI;
  long in_RDI;
  float fVar3;
  float fVar4;
  size_t idx_1;
  size_t i_3;
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur_p_new;
  size_t idx;
  size_t i_2;
  size_t last_idx;
  float cum_sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  float shifted_score;
  size_t i_1;
  vector<float,_std::allocator<float>_> shifted_scores;
  size_t i;
  float entropy;
  llama_sampler_typical *ctx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec8;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *this;
  undefined8 in_stack_fffffffffffffed0;
  int __value;
  ulong uVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed8;
  value_type *__x;
  allocator_type *in_stack_fffffffffffffee0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  __last;
  llama_token_data_array *in_stack_fffffffffffffef0;
  __normal_iterator<llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  __first_00;
  size_type local_e8;
  vector<llama_token_data,_std::allocator<llama_token_data>_> local_e0;
  value_type local_c8;
  ulong local_c0;
  size_type local_b8;
  float local_ac;
  undefined1 *local_a8;
  unsigned_long *local_a0;
  unsigned_long *local_98;
  unsigned_long *local_90;
  unsigned_long *local_88;
  undefined1 local_79;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  float local_4c;
  ulong local_48;
  undefined1 local_40 [24];
  ulong local_28;
  float local_1c;
  float *local_18;
  long *local_10;
  
  local_18 = *(float **)(in_RDI + 8);
  if (*local_18 < 1.0) {
    local_10 = in_RSI;
    llama_sampler_softmax_impl(in_stack_fffffffffffffef0);
    local_1c = 0.0;
    for (local_28 = 0; local_28 < (ulong)local_10[1]; local_28 = local_28 + 1) {
      fVar4 = *(float *)(*local_10 + local_28 * 0xc + 8);
      fVar3 = logf(*(float *)(*local_10 + local_28 * 0xc + 8));
      local_1c = -fVar4 * fVar3 + local_1c;
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x51d6d1);
    for (local_48 = 0; __value = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
        local_48 < (ulong)local_10[1]; local_48 = local_48 + 1) {
      fVar4 = logf(*(float *)(*local_10 + 8 + local_48 * 0xc));
      local_4c = ABS(-fVar4 - local_1c);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0,
                 (value_type_conflict5 *)in_stack_fffffffffffffed8._M_current);
    }
    __last._M_current = (llama_token_data *)local_10[1];
    __first_00._M_current = (llama_token_data *)&local_79;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x51d7b3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__first_00._M_current,
               (size_type)__last._M_current,in_stack_fffffffffffffee0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x51d7d9);
    __first._M_current = (unsigned_long *)&local_78;
    local_88 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffec8);
    local_90 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffec8);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
              (__first,in_stack_fffffffffffffed8,__value);
    __x = (value_type *)&local_78;
    local_98 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffec8);
    local_a0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffec8);
    local_a8 = local_40;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first_00._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current,(anon_class_8_1_3555cbbd)__first._M_current);
    local_ac = 0.0;
    local_b8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_78);
    local_c0 = 0;
    while (uVar5 = local_c0,
          sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_78),
          uVar5 < sVar1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_78,local_c0);
      local_c8 = *pvVar2;
      local_ac = *(float *)(*local_10 + local_c8 * 0xc + 8) + local_ac;
      if ((*local_18 <= local_ac && local_ac != *local_18) &&
         (*(long *)(local_18 + 2) - 1U <= local_c0)) {
        local_b8 = local_c0 + 1;
        break;
      }
      local_c0 = local_c0 + 1;
    }
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
              ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x51d9b1);
    for (local_e8 = 0; local_e8 < local_b8; local_e8 = local_e8 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_78,local_e8);
      std::vector<llama_token_data,_std::allocator<llama_token_data>_>::push_back
                ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)__first._M_current,
                 __x);
    }
    this = &local_e0;
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::begin(this);
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::end(this);
    std::
    copy<__gnu_cxx::__normal_iterator<llama_token_data*,std::vector<llama_token_data,std::allocator<llama_token_data>>>,llama_token_data*>
              (__first_00,__last,(llama_token_data *)__first._M_current);
    sVar1 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size(&local_e0);
    local_10[1] = sVar1;
    *(undefined1 *)(local_10 + 3) = 0;
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::~vector
              ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)__first._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__first._M_current);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)__first._M_current);
  }
  return;
}

Assistant:

static void llama_sampler_typical_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_typical *) smpl->ctx;

    // Reference implementation:
    // https://github.com/huggingface/transformers/compare/main...cimeister:typical-sampling:typical-pr
    if (ctx->p >= 1.0f) {
        return;
    }

    // Compute the softmax of logits and calculate entropy
    llama_sampler_softmax_impl(cur_p);

    float entropy = 0.0f;
    for (size_t i = 0; i < cur_p->size; ++i) {
        entropy += -cur_p->data[i].p * logf(cur_p->data[i].p);
    }

    // Compute the absolute difference between negative log probability and entropy for each candidate
    std::vector<float> shifted_scores;
    for (size_t i = 0; i < cur_p->size; ++i) {
        float shifted_score = fabsf(-logf(cur_p->data[i].p) - entropy);
        shifted_scores.push_back(shifted_score);
    }

    // Sort tokens based on the shifted_scores and their corresponding indices
    std::vector<size_t> indices(cur_p->size);
    std::iota(indices.begin(), indices.end(), 0);

    std::sort(indices.begin(), indices.end(), [&](size_t a, size_t b) {
        return shifted_scores[a] < shifted_scores[b];
    });

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = indices.size();

    for (size_t i = 0; i < indices.size(); ++i) {
        size_t idx = indices[i];
        cum_sum += cur_p->data[idx].p;

        // Check if the running sum is greater than typical or if we have kept at least min_keep tokens
        if (cum_sum > ctx->p && i >= ctx->min_keep - 1) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the locally typical tokens
    std::vector<llama_token_data> cur_p_new;
    for (size_t i = 0; i < last_idx; ++i) {
        size_t idx = indices[i];
        cur_p_new.push_back(cur_p->data[idx]);
    }

    // Replace the data in cur_p with the cur_p_new data
    std::copy(cur_p_new.begin(), cur_p_new.end(), cur_p->data);
    cur_p->size = cur_p_new.size();
    cur_p->sorted = false;
}